

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deduce_scope.cpp
# Opt level: O1

int main(void)

{
  i injector;
  injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_interface,_implementation,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
  local_14;
  stack local_13;
  direct local_12;
  stack_over_heap local_11;
  any_type_ref<example,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_interface,_implementation,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>_>
  local_10;
  any_type_ref<example,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_interface,_implementation,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>_>
  local_8;
  
  local_10.injector_ = &local_14;
  local_8.injector_ = local_10.injector_;
  boost::ext::di::v1_3_0::providers::stack_over_heap::
  get<example,boost::ext::di::v1_3_0::core::successful::any_type_ref<example,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,interface,implementation,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>>,boost::ext::di::v1_3_0::core::successful::any_type_ref<example,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,interface,implementation,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>>>
            (&local_11,&local_12,&local_13,&local_8,&local_10);
  return 0;
}

Assistant:

int main() {
  /*<<create injector with deduced `interface`>>*/
  // clang-format off
  auto injector = di::make_injector(
    di::bind<interface>().to<implementation>()  // => di::bind<interface>().to<implementation>().in(di::deduce)
  );
  // clang-format on

  /*<<create `example`>>*/
  injector.create<example>();
}